

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
          (BindDirectiveSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token bind,NameSyntax *target,BindTargetListSyntax *targetInstances,
          MemberSyntax *instantiation)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = bind._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = BindDirective;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bad98;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(BindDirectiveSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->bind).kind = (short)uVar5;
  (this->bind).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->bind).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->bind).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->bind).info = bind.info;
  (this->target).ptr = target;
  this->targetInstances = targetInstances;
  (this->instantiation).ptr = instantiation;
  (target->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (targetInstances != (BindTargetListSyntax *)0x0) {
    (targetInstances->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (instantiation->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

BindDirectiveSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token bind, NameSyntax& target, BindTargetListSyntax* targetInstances, MemberSyntax& instantiation) :
        MemberSyntax(SyntaxKind::BindDirective, attributes), bind(bind), target(&target), targetInstances(targetInstances), instantiation(&instantiation) {
        this->target->parent = this;
        if (this->targetInstances) this->targetInstances->parent = this;
        this->instantiation->parent = this;
    }